

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_incorrectNumberOfImportSources_Test::~Parser_incorrectNumberOfImportSources_Test
          (Parser_incorrectNumberOfImportSources_Test *this)

{
  Parser_incorrectNumberOfImportSources_Test *this_local;
  
  ~Parser_incorrectNumberOfImportSources_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, incorrectNumberOfImportSources)
{
    const std::string modelString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"import.cellml\">\n"
        "    <component component_ref=\"myComponent\" name=\"myImportedComponent\"/>\n"
        "  </import>\n"
        "  <component name=\"myConcreteComponent\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"myConcreteComponent\">\n"
        "      <component_ref component=\"myImportedComponent\"/>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>";

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelString);
    EXPECT_TRUE(model->component("myImportedComponent")->isImport());
    EXPECT_FALSE(model->component("myConcreteComponent")->isImport());
}